

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qset.h
# Opt level: O3

QSet<QWidget_*> operator-(QSet<QWidget_*> *lhs,QSet<QWidget_*> *rhs)

{
  ulong uVar1;
  Data *pDVar2;
  long *in_RDX;
  ulong uVar3;
  Data *pDVar4;
  long in_FS_OFFSET;
  QHash<QWidget_*,_QHashDummyValue> local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_30.d = (rhs->q_hash).d;
  if (local_30.d == (Data *)0x0) {
    pDVar2 = (Data *)0x0;
  }
  else {
    pDVar2 = local_30.d;
    if (((local_30.d)->ref).atomic._q_value.super___atomic_base<int>._M_i != -1) {
      LOCK();
      ((local_30.d)->ref).atomic._q_value.super___atomic_base<int>._M_i =
           ((local_30.d)->ref).atomic._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  pDVar4 = (Data *)*in_RDX;
  if (pDVar2 == pDVar4) {
    QHash<QWidget_*,_QHashDummyValue>::clear(&local_30);
    goto LAB_0043ae32;
  }
  if (pDVar4 == (Data *)0x0) {
    pDVar4 = (Data *)0x0;
    uVar3 = 0;
LAB_0043adb1:
    if (pDVar4 == (Data *)0x0 && uVar3 == 0) goto LAB_0043ae32;
  }
  else {
    if (pDVar4->spans->offsets[0] == 0xff) {
      uVar1 = 1;
      do {
        uVar3 = uVar1;
        if (pDVar4->numBuckets == uVar3) {
          pDVar4 = (Data *)0x0;
          uVar3 = 0;
          break;
        }
        uVar1 = uVar3 + 1;
      } while (pDVar4->spans[uVar3 >> 7].offsets[(uint)uVar3 & 0x7f] == 0xff);
      goto LAB_0043adb1;
    }
    uVar3 = 0;
  }
  do {
    QHash<QWidget*,QHashDummyValue>::removeImpl<QWidget*>
              ((QHash<QWidget*,QHashDummyValue> *)&local_30,
               (QWidget **)
               (pDVar4->spans[uVar3 >> 7].entries +
               pDVar4->spans[uVar3 >> 7].offsets[(uint)uVar3 & 0x7f]));
    do {
      if (pDVar4->numBuckets - 1 == uVar3) {
        pDVar4 = (Data *)0x0;
        uVar3 = 0;
        break;
      }
      uVar3 = uVar3 + 1;
    } while (pDVar4->spans[uVar3 >> 7].offsets[(uint)uVar3 & 0x7f] == 0xff);
  } while ((pDVar4 != (Data *)0x0) || (uVar3 != 0));
LAB_0043ae32:
  (lhs->q_hash).d = local_30.d;
  if ((local_30.d != (Data *)0x0) &&
     (((local_30.d)->ref).atomic._q_value.super___atomic_base<int>._M_i != -1)) {
    LOCK();
    ((local_30.d)->ref).atomic._q_value.super___atomic_base<int>._M_i =
         ((local_30.d)->ref).atomic._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  QHash<QWidget_*,_QHashDummyValue>::~QHash(&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return (QSet<QWidget_*>)(Hash)lhs;
}

Assistant:

friend QSet operator-(const QSet &lhs, const QSet &rhs) { return QSet(lhs) -= rhs; }